

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_TextureMapping::IsValid(ON_TextureMapping *this,ON_TextLog *text_log)

{
  TYPE TVar1;
  PROJECTION PVar2;
  TEXTURE_SPACE TVar3;
  TYPE TVar4;
  PROJECTION PVar5;
  TEXTURE_SPACE TVar6;
  ON_TextLog *text_log_local;
  ON_TextureMapping *this_local;
  
  TVar1 = this->m_type;
  TVar4 = TypeFromUnsigned(this->m_type);
  if (TVar1 == TVar4) {
    PVar2 = this->m_projection;
    PVar5 = ProjectionFromUnsigned(this->m_projection);
    if (PVar2 == PVar5) {
      TVar3 = this->m_texture_space;
      TVar6 = TextureSpaceFromUnsigned(this->m_texture_space);
      if (TVar3 == TVar6) {
        this_local._7_1_ = true;
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_TextureMapping m_texture_space = %d is not a valid value.\n",
                            (ulong)this->m_texture_space);
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_TextureMapping m_projection = %d is not a valid value.\n",
                          (ulong)this->m_projection);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_TextureMapping m_type = %d is not a valid value.\n",
                        (ulong)this->m_type);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_TextureMapping::IsValid( ON_TextLog* text_log ) const
{
  if ( m_type != ON_TextureMapping::TypeFromUnsigned( static_cast<unsigned int>(m_type) ) )
  {
    if ( text_log )
    {
      text_log->Print("ON_TextureMapping m_type = %d is not a valid value.\n",m_type);
    }
    return false;
  }

  if ( m_projection != ON_TextureMapping::ProjectionFromUnsigned( static_cast<unsigned int>(m_projection) ) )
  {
    if ( text_log )
    {
      text_log->Print("ON_TextureMapping m_projection = %d is not a valid value.\n",m_projection);
    }
    return false;
  }

  if (m_texture_space != ON_TextureMapping::TextureSpaceFromUnsigned( static_cast<unsigned int>(m_texture_space)))
  {
	  if (text_log)
	  {
		  text_log->Print("ON_TextureMapping m_texture_space = %d is not a valid value.\n",m_texture_space);
	  }
	  return false;
  }

  return true;
}